

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

int __thiscall BpTree<float>::IsFew(BpTree<float> *this,IndexNode<float> *Node)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  vector<float,_std::allocator<float>_> local_80;
  vector<char,_std::allocator<char>_> local_68;
  vector<Addr,_std::allocator<Addr>_> local_50;
  Addr local_38;
  Addr AStack_30;
  
  cVar1 = Node->NodeState;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,&Node->k);
  std::vector<char,_std::allocator<char>_>::vector(&local_68,&Node->v);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_50,&Node->p);
  local_38 = Node->parent;
  AStack_30 = Node->self;
  if (local_50.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar4 = this->N;
  uVar2 = (ulong)uVar4;
  if (cVar1 == '1') {
    uVar2 = (ulong)(uVar4 - 1);
    if (1 < (int)uVar4) {
      uVar5 = 0;
      do {
        if ((Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] != '1') {
          uVar3 = uVar5 & 0xffffffff;
          break;
        }
        uVar5 = uVar5 + 1;
        uVar3 = uVar2;
      } while (uVar2 != uVar5);
      goto LAB_0013ada3;
    }
  }
  else if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      uVar3 = uVar5;
      if ((Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5].FileOff == -1) break;
      uVar5 = uVar5 + 1;
      uVar3 = uVar2;
    } while (uVar2 != uVar5);
    goto LAB_0013ada3;
  }
  uVar3 = 0;
LAB_0013ada3:
  uVar4 = (int)(uVar2 >> 0x1f) + (int)uVar2;
  return (int)((int)uVar3 <
              (int)((uint)((int)(uVar4 & 0xfffffffe) < (int)uVar2) + ((int)uVar4 >> 1)));
}

Assistant:

int BpTree<K>::IsFew(IndexNode<K> Node) {
	int i;
	if (this->IsLeaf(Node)) {
		for (i = 0; i < N - 1 && Node.v[i] == '1'; i++);
		return i < MIN_KEY_LEAF;
	}
	else {
		for (i = 0; i < N && Node.p[i].FileOff != -1; i++);
		return i < MIN_POINTS_NONLEAF;
	}
}